

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

int __thiscall DLoadSaveMenu::RemoveSaveSlot(DLoadSaveMenu *this,int index)

{
  FSaveGameNode *pFVar1;
  
  pFVar1 = SaveGames.Array[index];
  if (quickSaveSlot == pFVar1) {
    quickSaveSlot = (FSaveGameNode *)0x0;
  }
  if (this->Selected == index) {
    this->Selected = -1;
  }
  if (pFVar1->bNoDelete == false) {
    FString::~FString(&pFVar1->Filename);
    operator_delete(pFVar1,0x28);
  }
  TArray<FSaveGameNode_*,_FSaveGameNode_*>::Delete(&SaveGames,index);
  return index + -1 + (uint)((uint)index < SaveGames.Count);
}

Assistant:

int DLoadSaveMenu::RemoveSaveSlot (int index)
{
	FSaveGameNode *file = SaveGames[index];

	if (quickSaveSlot == SaveGames[index])
	{
		quickSaveSlot = NULL;
	}
	if (Selected == index)
	{
		Selected = -1;
	}
	if (!file->bNoDelete) delete file;
	SaveGames.Delete(index);
	if ((unsigned)index >= SaveGames.Size()) index--;
	return index;
}